

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScrollController.cpp
# Opt level: O3

Vector2f Rml::CalculateAutoscrollVelocity(Vector2f target_delta,float dp_ratio)

{
  float fVar1;
  float fVar2;
  Vector2f VVar3;
  Vector2f VVar4;
  undefined8 in_XMM0_Qb;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined4 uStack_24;
  
  auVar5._8_8_ = in_XMM0_Qb;
  auVar5._0_8_ = target_delta;
  auVar6._4_4_ = dp_ratio;
  auVar6._0_4_ = dp_ratio;
  auVar6._8_4_ = dp_ratio;
  auVar6._12_4_ = dp_ratio;
  auVar6 = divps(auVar5,auVar6);
  fVar1 = Math::Absolute(auVar6._0_4_);
  uStack_24 = auVar6._4_4_;
  fVar2 = Math::Absolute(uStack_24);
  fVar1 = (float)(-(uint)(10.0 <= fVar1) & (uint)auVar6._0_4_);
  uStack_24 = (float)(-(uint)(10.0 <= fVar2) & (uint)uStack_24);
  VVar3.y = uStack_24;
  VVar3.x = fVar1;
  VVar3 = Math::Absolute(VVar3);
  VVar4.x = VVar3.x * fVar1 * 0.09;
  VVar4.y = VVar3.y * uStack_24 * 0.09;
  return VVar4;
}

Assistant:

static Vector2f CalculateAutoscrollVelocity(Vector2f target_delta, float dp_ratio)
{
	target_delta = target_delta / dp_ratio;
	target_delta = {
		Math::Absolute(target_delta.x) < AUTOSCROLL_DEADZONE ? 0.f : target_delta.x,
		Math::Absolute(target_delta.y) < AUTOSCROLL_DEADZONE ? 0.f : target_delta.y,
	};

	// We use a signed square model for the velocity, which seems to work quite well. This is mostly about feeling and tuning.
	return AUTOSCROLL_SPEED_FACTOR * target_delta * Math::Absolute(target_delta);
}